

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_format.hpp
# Opt level: O0

CSVFormat * csv::CSVFormat::guess_csv(void)

{
  initializer_list<char> __l;
  CSVFormat *pCVar1;
  CSVFormat *in_RDI;
  allocator_type local_46;
  char local_45 [5];
  iterator local_40;
  size_type local_38;
  vector<char,_std::allocator<char>_> local_30;
  undefined1 local_11;
  CSVFormat *format;
  
  local_11 = 0;
  CSVFormat(in_RDI);
  builtin_strncpy(local_45,",|\t;^",5);
  local_40 = local_45;
  local_38 = 5;
  std::allocator<char>::allocator();
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<char,_std::allocator<char>_>::vector(&local_30,__l,&local_46);
  pCVar1 = delimiter(in_RDI,&local_30);
  pCVar1 = quote(pCVar1,'\"');
  header_row(pCVar1,0);
  std::vector<char,_std::allocator<char>_>::~vector(&local_30);
  std::allocator<char>::~allocator(&local_46);
  return in_RDI;
}

Assistant:

CSV_INLINE static CSVFormat guess_csv() {
            CSVFormat format;
            format.delimiter({ ',', '|', '\t', ';', '^' })
                .quote('"')
                .header_row(0);

            return format;
        }